

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  PHYSFS_uint64 PVar4;
  undefined8 uVar5;
  DirHandle *h;
  char *pcVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  PHYSFS_Io *pPVar10;
  FileHandle *pFVar11;
  undefined1 *puVar12;
  undefined8 *puVar13;
  size_t sVar14;
  undefined1 *ptr;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  char *local_30;
  char *arcfname;
  
  puVar12 = auStack_38;
  if (_fname == (char *)0x0) {
    uStack_40 = 0x1090f5;
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    uStack_40 = 0x1090af;
    __PHYSFS_platformGrabMutex(stateLock);
    h = writeDir;
    if (writeDir == (DirHandle *)0x0) {
      puVar13 = &uStack_40;
      uStack_40 = 0xd;
    }
    else {
      uStack_40 = 0x1090c3;
      sVar8 = strlen(_fname);
      sVar14 = h->rootlen + sVar8 + 1;
      if (sVar14 < 0x100) {
        puVar12 = auStack_38 + -(h->rootlen + sVar8 + 0x18 & 0xfffffffffffffff0);
        ptr = puVar12;
      }
      else {
        ptr = (undefined1 *)0x0;
      }
      *(undefined8 *)(puVar12 + -8) = 0x109108;
      pcVar9 = (char *)__PHYSFS_initSmallAlloc(ptr,sVar14);
      if (pcVar9 != (char *)0x0) {
        sVar14 = h->rootlen;
        *(undefined8 *)(puVar12 + -8) = 0x109123;
        iVar7 = sanitizePlatformIndependentPath(_fname,pcVar9 + sVar14);
        if (iVar7 != 0) {
          pFVar11 = (FileHandle *)0x0;
          local_30 = pcVar9;
          *(undefined8 *)(puVar12 + -8) = 0x10913f;
          iVar7 = verifyPath(h,&local_30,0);
          pcVar6 = local_30;
          if (iVar7 == 0) goto LAB_001091db;
          pvVar1 = h->opaque;
          p_Var2 = (&h->funcs->openWrite)[appending != 0];
          *(undefined8 *)(puVar12 + -8) = 0x10915e;
          pPVar10 = (*p_Var2)(pvVar1,pcVar6);
          if (pPVar10 != (PHYSFS_Io *)0x0) {
            *(undefined8 *)(puVar12 + -8) = 0x40;
            PVar4 = *(PHYSFS_uint64 *)(puVar12 + -8);
            *(undefined8 *)(puVar12 + -8) = 0x10916f;
            pFVar11 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(PVar4);
            if (pFVar11 != (FileHandle *)0x0) {
              *(undefined8 *)&pFVar11->forReading = 0;
              pFVar11->dirHandle = (DirHandle *)0x0;
              pFVar11->buffill = 0;
              pFVar11->bufpos = 0;
              pFVar11->buffer = (PHYSFS_uint8 *)0x0;
              pFVar11->bufsize = 0;
              pFVar11->io = pPVar10;
              pFVar11->dirHandle = h;
              pFVar11->next = openWriteList;
              openWriteList = pFVar11;
              goto LAB_001091db;
            }
            p_Var3 = pPVar10->destroy;
            *(undefined8 *)(puVar12 + -8) = 0x1091d0;
            (*p_Var3)(pPVar10);
            *(undefined8 *)(puVar12 + -8) = 2;
            uVar5 = *(undefined8 *)(puVar12 + -8);
            *(undefined8 *)(puVar12 + -8) = 0x1091d8;
            PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
          }
        }
        pFVar11 = (FileHandle *)0x0;
LAB_001091db:
        *(undefined8 *)(puVar12 + -8) = 0x1091e7;
        __PHYSFS_platformReleaseMutex(stateLock);
        if (*(long *)(pcVar9 + -8) == 0) {
          return (PHYSFS_File *)pFVar11;
        }
        *(undefined8 *)(puVar12 + -8) = 0x1091fb;
        (*__PHYSFS_AllocatorHooks.Free)(pcVar9 + -8);
        return (PHYSFS_File *)pFVar11;
      }
      puVar13 = (undefined8 *)(puVar12 + -8);
      *(undefined8 *)(puVar12 + -8) = 2;
    }
    uVar5 = *puVar13;
    *puVar13 = 0x1091aa;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
    *puVar13 = 0x1091b6;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return (PHYSFS_File *)0x0;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, const int appending)
{
    FileHandle *fh = NULL;
    DirHandle *h;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    h = writeDir;
    BAIL_IF_MUTEX(!h, PHYSFS_ERR_NO_WRITE_DIR, stateLock, 0);

    len = strlen(_fname) + dirHandleRootLen(h) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);

    if (sanitizePlatformIndependentPathWithRoot(h, _fname, fname))
    {
        PHYSFS_Io *io = NULL;
        char *arcfname = fname;
        if (verifyPath(h, &arcfname, 0))
        {
            const PHYSFS_Archiver *f = h->funcs;
            if (appending)
                io = f->openAppend(h->opaque, arcfname);
            else
                io = f->openWrite(h->opaque, arcfname);

            if (io)
            {
                fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
                if (fh == NULL)
                {
                    io->destroy(io);
                    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                } /* if */
                else
                {
                    memset(fh, '\0', sizeof (FileHandle));
                    fh->io = io;
                    fh->dirHandle = h;
                    fh->next = openWriteList;
                    openWriteList = fh;
                } /* else */
            } /* if */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}